

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void * fio_realloc2(void *ptr,size_t new_size,size_t copy_length)

{
  ulong *__addr;
  void *pvVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  ulong __len;
  
  if (ptr == (void *)0x0 || (longdouble *)ptr == &on_malloc_zero) {
    pvVar1 = fio_malloc(new_size);
    return pvVar1;
  }
  if (new_size == 0) {
    fio_free(ptr);
    return &on_malloc_zero;
  }
  if (((uint)ptr & 0x7fff) == 0x10) {
    __addr = (ulong *)((long)ptr + -0x10);
    uVar4 = (ulong)((new_size + 0x10 & 0xfff) != 0) * 0x1000 +
            (new_size + 0x10 & 0xfffffffffffff000);
    uVar3 = *(ulong *)((long)ptr + -0x10);
    sVar5 = uVar4 - uVar3;
    puVar2 = __addr;
    if (uVar4 < uVar3 || sVar5 == 0) {
      if (uVar4 + 0x1000 < uVar3) {
        munmap((void *)((long)__addr + uVar4),uVar3 - uVar4);
      }
    }
    else {
      puVar2 = (ulong *)mremap(__addr,uVar3,uVar4,0);
      if (puVar2 == (ulong *)0x0) {
        return (void *)0x0;
      }
      if ((puVar2 == (ulong *)0xffffffffffffffff) &&
         (pvVar1 = mmap((void *)(uVar3 + (long)__addr),sVar5,3,0x22,-1,0), puVar2 = __addr,
         pvVar1 != (void *)(uVar3 + (long)__addr))) {
        munmap(pvVar1,sVar5);
        puVar2 = (ulong *)mmap(sys_alloc_next_alloc,uVar4,3,0x22,-1,0);
        if (puVar2 == (ulong *)0xffffffffffffffff) {
          return (void *)0x0;
        }
        if (((ulong)puVar2 & 0x7fff) != 0) {
          munmap(puVar2,uVar4);
          pvVar1 = mmap((void *)0x0,uVar4 + 0x8000,3,0x22,-1,0);
          if (pvVar1 == (void *)0xffffffffffffffff) {
            return (void *)0x0;
          }
          __len = (ulong)((uint)pvVar1 & 0x7fff);
          sVar5 = 0x8000 - __len;
          munmap(pvVar1,sVar5);
          puVar2 = (ulong *)(sVar5 + (long)pvVar1);
          munmap((void *)((long)puVar2 + uVar4),__len);
        }
        sys_alloc_next_alloc = puVar2 + 0x8000000;
        if (puVar2 == (ulong *)0x0) goto LAB_00132269;
        fio_memcpy(puVar2,__addr,uVar3 >> 4);
        munmap(__addr,uVar3);
      }
    }
    *puVar2 = uVar4;
    puVar2 = puVar2 + 2;
  }
  else {
    pvVar1 = fio_malloc(new_size);
    if (pvVar1 != (void *)0x0) {
      uVar4 = ((new_size >> 4) + 1) - (ulong)((new_size & 0xf) == 0);
      uVar3 = ((copy_length >> 4) + 1) - (ulong)((copy_length & 0xf) == 0);
      if (uVar4 <= uVar3) {
        uVar3 = uVar4;
      }
      fio_memcpy(pvVar1,ptr,uVar3);
      block_free((block_s *)((ulong)ptr & 0xffffffffffff8000));
      return pvVar1;
    }
LAB_00132269:
    puVar2 = (ulong *)0x0;
  }
  return puVar2;
}

Assistant:

void *fio_realloc2(void *ptr, size_t new_size, size_t copy_length) {
  if (!ptr || ptr == (void *)&on_malloc_zero) {
    return fio_malloc(new_size);
  }
  if (!new_size) {
    goto zero_size;
  }
  if (((uintptr_t)ptr & FIO_MEMORY_BLOCK_MASK) == 16) {
    /* big reallocation - direct from the system */
    return big_realloc(ptr, new_size);
  }
  /* allocated within block - don't even try to expand the allocation */
  /* ceiling for 16 byte alignement, translated to 16 byte units */
  void *new_mem = fio_malloc(new_size);
  if (!new_mem)
    return NULL;
  new_size = ((new_size >> 4) + (!!(new_size & 15)));
  copy_length = ((copy_length >> 4) + (!!(copy_length & 15)));
  fio_memcpy(new_mem, ptr, copy_length > new_size ? new_size : copy_length);

  block_slice_free(ptr);
  return new_mem;
zero_size:
  fio_free(ptr);
  return fio_malloc(0);
}